

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_java_generator.cc
# Opt level: O0

void __thiscall
t_java_generator::generate_java_struct_tuple_scheme
          (t_java_generator *this,ostream *out,t_struct *tstruct)

{
  t_struct *ptVar1;
  int iVar2;
  ostream *poVar3;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  undefined4 extraout_var_03;
  string local_70;
  string local_40;
  t_struct *local_20;
  t_struct *tstruct_local;
  ostream *out_local;
  t_java_generator *this_local;
  
  local_20 = tstruct;
  tstruct_local = (t_struct *)out;
  out_local = (ostream *)this;
  poVar3 = t_generator::indent((t_generator *)this,out);
  poVar3 = std::operator<<(poVar3,"private static class ");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var,iVar2));
  poVar3 = std::operator<<(poVar3,
                           "TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {")
  ;
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"public ");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_00,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme getScheme() {");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"return new ");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_01,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme();");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"}");
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  t_generator::indent_down((t_generator *)this);
  poVar3 = t_generator::indent((t_generator *)this,(ostream *)tstruct_local);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_40,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_40);
  poVar3 = std::operator<<(poVar3,"private static class ");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_02,iVar2));
  poVar3 = std::operator<<(poVar3,"TupleScheme extends org.apache.thrift.scheme.TupleScheme<");
  iVar2 = (*(local_20->super_t_type).super_t_doc._vptr_t_doc[3])();
  poVar3 = std::operator<<(poVar3,(string *)CONCAT44(extraout_var_03,iVar2));
  poVar3 = std::operator<<(poVar3,"> {");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_40);
  t_generator::indent_up((t_generator *)this);
  generate_java_struct_tuple_writer(this,(ostream *)tstruct_local,local_20);
  std::operator<<((ostream *)tstruct_local,(string *)&::endl_abi_cxx11_);
  generate_java_struct_tuple_reader(this,(ostream *)tstruct_local,local_20);
  t_generator::indent_down((t_generator *)this);
  ptVar1 = tstruct_local;
  t_generator::indent_abi_cxx11_(&local_70,(t_generator *)this);
  poVar3 = std::operator<<((ostream *)ptVar1,(string *)&local_70);
  poVar3 = std::operator<<(poVar3,"}");
  poVar3 = std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar3,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string((string *)&local_70);
  return;
}

Assistant:

void t_java_generator::generate_java_struct_tuple_scheme(ostream& out, t_struct* tstruct) {
  indent(out) << "private static class " << tstruct->get_name()
              << "TupleSchemeFactory implements org.apache.thrift.scheme.SchemeFactory {" << endl;
  indent_up();
  indent(out) << "public " << tstruct->get_name() << "TupleScheme getScheme() {" << endl;
  indent_up();
  indent(out) << "return new " << tstruct->get_name() << "TupleScheme();" << endl;
  indent_down();
  indent(out) << "}" << endl;
  indent_down();
  indent(out) << "}" << endl << endl;
  out << indent() << "private static class " << tstruct->get_name()
      << "TupleScheme extends org.apache.thrift.scheme.TupleScheme<" << tstruct->get_name() << "> {" << endl << endl;
  indent_up();
  generate_java_struct_tuple_writer(out, tstruct);
  out << endl;
  generate_java_struct_tuple_reader(out, tstruct);
  indent_down();
  out << indent() << "}" << endl << endl;
}